

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableDatum.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::VariableDatum::GetDatumValueAsKString_abi_cxx11_
          (KString *__return_storage_ptr__,VariableDatum *this)

{
  pointer pDVar1;
  ulong uVar2;
  int iVar3;
  pointer pDVar4;
  double dVar5;
  KStringStream ss;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  pDVar4 = (this->m_v8DatumValue).
           super__Vector_base<KDIS::DATA_TYPE::VariableDatum::DatumEntry,_std::allocator<KDIS::DATA_TYPE::VariableDatum::DatumEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pDVar1 = (this->m_v8DatumValue).
           super__Vector_base<KDIS::DATA_TYPE::VariableDatum::DatumEntry,_std::allocator<KDIS::DATA_TYPE::VariableDatum::DatumEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  dVar5 = ceil((double)this->m_ui32DatumLength * 0.125);
  iVar3 = 0;
  for (; pDVar4 != pDVar1; pDVar4 = pDVar4 + 1) {
    for (uVar2 = 0; ((uint)(iVar3 + (int)uVar2) < (uint)(long)dVar5 && (uVar2 < 8));
        uVar2 = uVar2 + 1) {
      std::operator<<(local_1a8,pDVar4->Buffer[uVar2]);
    }
    iVar3 = iVar3 + (int)uVar2;
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

KString VariableDatum::GetDatumValueAsKString() const
{
    KStringStream ss;

    vector<DatumEntry>::const_iterator citr =  m_v8DatumValue.begin();
    vector<DatumEntry>::const_iterator citrEnd = m_v8DatumValue.end();

    KUINT32 i = 0;

    KUINT32 ui32LengthInOctets = ceil(m_ui32DatumLength / 8.0);

    while( citr != citrEnd )
    {
        for( KUINT16 j = 0; i < ui32LengthInOctets && j < 8; ++j, ++i )
        {
            ss << citr->Buffer[j];
        }
        ++citr;
    }

    return ss.str();
}